

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall
Renderer::renderLighting
          (Renderer *this,vector<Light_*,_std::allocator<Light_*>_> *lights,Shader *shader)

{
  GLuint GVar1;
  Light *pLVar2;
  PFNGLGETUNIFORMLOCATIONPROC p_Var3;
  PFNGLUNIFORM1FPROC p_Var4;
  PFNGLUNIFORM1IPROC p_Var5;
  PFNGLUNIFORM3FPROC p_Var6;
  GLint GVar7;
  ulong uVar8;
  stringstream local_230 [8];
  stringstream indexString;
  ostream local_220 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ulong local_48;
  Shader *local_40;
  vector<Light_*,_std::allocator<Light_*>_> *local_38;
  
  p_Var5 = __glewUniform1i;
  local_40 = shader;
  GVar7 = (*__glewGetUniformLocation)(shader->programId,"numLights");
  local_38 = lights;
  (*p_Var5)(GVar7,(GLint)((ulong)((long)(lights->
                                        super__Vector_base<Light_*,_std::allocator<Light_*>_>).
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(lights->
                                       super__Vector_base<Light_*,_std::allocator<Light_*>_>).
                                       _M_impl.super__Vector_impl_data._M_start) >> 3));
  for (uVar8 = 0;
      uVar8 < (ulong)((long)(local_38->super__Vector_base<Light_*,_std::allocator<Light_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_38->super__Vector_base<Light_*,_std::allocator<Light_*>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    std::__cxx11::stringstream::stringstream(local_230);
    local_48 = uVar8;
    std::ostream::operator<<(local_220,(int)uVar8);
    p_Var6 = __glewUniform3f;
    p_Var3 = __glewGetUniformLocation;
    GVar1 = local_40->programId;
    std::__cxx11::stringbuf::str();
    std::operator+(&local_a8,"pointLights[",&local_88);
    std::operator+(&local_68,&local_a8,"].position");
    GVar7 = (*p_Var3)(GVar1,local_68._M_dataplus._M_p);
    pLVar2 = (local_38->super__Vector_base<Light_*,_std::allocator<Light_*>_>)._M_impl.
             super__Vector_impl_data._M_start[local_48];
    (*p_Var6)(GVar7,(pLVar2->position).field_0.field_0.x,(pLVar2->position).field_0.field_0.y,
              (pLVar2->position).field_0.field_0.z);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    p_Var6 = __glewUniform3f;
    p_Var3 = __glewGetUniformLocation;
    GVar1 = local_40->programId;
    std::__cxx11::stringbuf::str();
    std::operator+(&local_a8,"pointLights[",&local_88);
    std::operator+(&local_68,&local_a8,"].color");
    GVar7 = (*p_Var3)(GVar1,local_68._M_dataplus._M_p);
    pLVar2 = (local_38->super__Vector_base<Light_*,_std::allocator<Light_*>_>)._M_impl.
             super__Vector_impl_data._M_start[local_48];
    (*p_Var6)(GVar7,(pLVar2->color).field_0.field_0.x,(pLVar2->color).field_0.field_0.y,
              (pLVar2->color).field_0.field_0.z);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    p_Var4 = __glewUniform1f;
    p_Var3 = __glewGetUniformLocation;
    GVar1 = local_40->programId;
    std::__cxx11::stringbuf::str();
    std::operator+(&local_a8,"pointLights[",&local_88);
    std::operator+(&local_68,&local_a8,"].brightness");
    GVar7 = (*p_Var3)(GVar1,local_68._M_dataplus._M_p);
    uVar8 = local_48;
    (*p_Var4)(GVar7,(local_38->super__Vector_base<Light_*,_std::allocator<Light_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[local_48]->brightness);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::stringstream::~stringstream(local_230);
  }
  return;
}

Assistant:

void Renderer::renderLighting(std::vector<Light*> lights, Shader* shader)
{
	glUniform1i(glGetUniformLocation(shader->getProgramId(), "numLights"), lights.size());

	for (int i = 0; i < lights.size(); i++)
	{
		std::stringstream indexString;
		indexString << i;
		glUniform3f(glGetUniformLocation(shader->getProgramId(), ("pointLights[" + indexString.str() + "].position").c_str()), lights[i]->position.x, lights[i]->position.y, lights[i]->position.z);
		glUniform3f(glGetUniformLocation(shader->getProgramId(), ("pointLights[" + indexString.str() + "].color").c_str()), lights[i]->color.x, lights[i]->color.y, lights[i]->color.z);
		glUniform1f(glGetUniformLocation(shader->getProgramId(), ("pointLights[" + indexString.str() + "].brightness").c_str()), lights[i]->brightness);
	}
}